

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiString * __thiscall
Assimp::FBX::FBXConverter::GetTexturePath
          (aiString *__return_storage_ptr__,FBXConverter *this,Texture *tex)

{
  ulong __n;
  key_type *__k;
  byte bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *__s;
  bool bVar7;
  bool bVar8;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  __s = __return_storage_ptr__->data + 1;
  memset(__s,0x1b,0x3ff);
  __n = (tex->relativeFileName)._M_string_length;
  if (__n < 0x400) {
    __return_storage_ptr__->length = (ai_uint32)__n;
    memcpy(__return_storage_ptr__->data,(tex->relativeFileName)._M_dataplus._M_p,__n);
    __return_storage_ptr__->data[__n] = '\0';
  }
  __k = tex->media;
  if (__k != (key_type *)0x0) {
    iVar2 = std::
            _Rb_tree<const_Assimp::FBX::Video,_std::pair<const_Assimp::FBX::Video,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
            ::find(&(this->textures_converted)._M_t,__k);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header) {
      if (__k->contentLength == 0) {
        return __return_storage_ptr__;
      }
      uVar5 = ConvertVideo(this,__k);
      pmVar3 = std::
               map<const_Assimp::FBX::Video,_unsigned_int,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
               ::operator[](&this->textures_converted,__k);
      *pmVar3 = uVar5;
    }
    else {
      uVar5 = *(uint *)&iVar2._M_node[6]._M_right;
    }
    if (this->doc->settings->useLegacyEmbeddedTextureNaming == true) {
      __return_storage_ptr__->data[0] = '*';
      uVar4 = 1;
      if ((int)uVar5 < 0) {
        __s = __return_storage_ptr__->data + 2;
        __return_storage_ptr__->data[1] = '-';
        uVar5 = -uVar5;
        uVar4 = 2;
      }
      iVar6 = 1000000000;
      bVar1 = 0;
      do {
        bVar7 = (int)((long)(int)uVar5 / (long)iVar6) != 0;
        bVar8 = iVar6 == 1;
        if ((bool)(bVar1 | bVar8 | bVar7)) {
          *__s = (char)((long)(int)uVar5 / (long)iVar6) + '0';
          __s = __s + 1;
          uVar4 = uVar4 + 1;
          uVar5 = (int)uVar5 % iVar6;
          if (iVar6 == 1) break;
        }
        iVar6 = iVar6 / 10;
        bVar1 = bVar1 | bVar8 | bVar7;
      } while (uVar4 < 0x3ff);
      *__s = '\0';
      __return_storage_ptr__->length = uVar4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

aiString FBXConverter::GetTexturePath(const Texture* tex)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr) {
                bool textureReady = false; //tells if our texture is ready (if it was loaded or if it was found)
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(*media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                    textureReady = true;
                }
                else {
                    if (media->ContentLength() > 0) {
                        index = ConvertVideo(*media);
                        textures_converted[*media] = index;
                        textureReady = true;
                    }
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture), if the texture is ready
                if (doc.Settings().useLegacyEmbeddedTextureNaming) {
                    if (textureReady) {
                        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
                        // In FBX files textures are now stored internally by Assimp with their filename included
                        // Now Assimp can lookup through the loaded textures after all data is processed
                        // We need to load all textures before referencing them, as FBX file format order may reference a texture before loading it
                        // This may occur on this case too, it has to be studied
                        path.data[0] = '*';
                        path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
                    }
                }
            }

            return path;
        }